

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_chat.cpp
# Opt level: O3

bool CT_Responder(event_t *ev)

{
  byte bVar1;
  char *in_RAX;
  long lVar2;
  ushort uVar3;
  BYTE *str;
  FString local_18;
  
  if (chatmodeon == 0) {
    return false;
  }
  if (ev->type != '\x04') {
    return false;
  }
  bVar1 = ev->subtype;
  local_18.Chars = in_RAX;
  if (bVar1 - 1 < 2) {
    uVar3 = ev->data1;
    if (0x1a < uVar3) {
      if (uVar3 == 0x1b) {
        chatmodeon = 0;
        return true;
      }
      if (uVar3 == 0x43) {
        if ((ev->data3 & 2) == 0) {
          return false;
        }
        I_PutInClipboard((char *)ChatQueue);
        return true;
      }
      if (uVar3 != 0x56) {
        return false;
      }
      if ((ev->data3 & 2) != 0) {
        I_GetFromClipboard(SUB81(&local_18,0));
        CT_PasteChat(local_18.Chars);
        FString::~FString(&local_18);
        return false;
      }
      return false;
    }
    if (uVar3 == 8) {
      lVar2 = (long)len;
      if (lVar2 == 0) {
        return true;
      }
      len = len + -1;
      (&DAT_00a4e96f)[lVar2] = 0;
      return true;
    }
    if (uVar3 != 0xd) {
      return false;
    }
    str = ChatQueue;
  }
  else {
    if (bVar1 != 4) {
      if (bVar1 == 10) {
        I_GetFromClipboard(SUB81(&local_18,0));
        CT_PasteChat(local_18.Chars);
        FString::~FString(&local_18);
        return false;
      }
      return false;
    }
    if ((ev->data2 == 0) || (uVar3 = ev->data1 - 0x30, 9 < uVar3)) {
      lVar2 = (long)len;
      if (0x7d < lVar2) {
        return true;
      }
      len = len + 1;
      ChatQueue[lVar2] = (BYTE)ev->data1;
      ChatQueue[lVar2 + 1] = '\0';
      return true;
    }
    str = (BYTE *)chat_macros[uVar3]->Value;
  }
  ShoveChatStr((char *)str,(char)chatmodeon + 0xff);
  chatmodeon = 0;
  return true;
}

Assistant:

bool CT_Responder (event_t *ev)
{
	if (chatmodeon && ev->type == EV_GUI_Event)
	{
		if (ev->subtype == EV_GUI_KeyDown || ev->subtype == EV_GUI_KeyRepeat)
		{
			if (ev->data1 == '\r')
			{
				ShoveChatStr ((char *)ChatQueue, chatmodeon - 1);
				CT_Stop ();
				return true;
			}
			else if (ev->data1 == GK_ESCAPE)
			{
				CT_Stop ();
				return true;
			}
			else if (ev->data1 == '\b')
			{
				CT_BackSpace ();
				return true;
			}
#ifdef __APPLE__
			else if (ev->data1 == 'C' && (ev->data3 & GKM_META))
#else // !__APPLE__
			else if (ev->data1 == 'C' && (ev->data3 & GKM_CTRL))
#endif // __APPLE__
			{
				I_PutInClipboard ((char *)ChatQueue);
				return true;
			}
#ifdef __APPLE__
			else if (ev->data1 == 'V' && (ev->data3 & GKM_META))
#else // !__APPLE__
			else if (ev->data1 == 'V' && (ev->data3 & GKM_CTRL))
#endif // __APPLE__
			{
				CT_PasteChat(I_GetFromClipboard(false));
			}
		}
		else if (ev->subtype == EV_GUI_Char)
		{
			// send a macro
			if (ev->data2 && (ev->data1 >= '0' && ev->data1 <= '9'))
			{
				ShoveChatStr (*chat_macros[ev->data1 - '0'], chatmodeon - 1);
				CT_Stop ();
			}
			else
			{
				CT_AddChar (char(ev->data1));
			}
			return true;
		}
#ifdef __unix__
		else if (ev->subtype == EV_GUI_MButtonDown)
		{
			CT_PasteChat(I_GetFromClipboard(true));
		}
#endif
	}

	return false;
}